

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O1

void __thiscall ProtocolIPv4::Retry(ProtocolIPv4 *this)

{
  osQueue *this_00;
  int iVar1;
  long *item;
  uint8_t *puVar2;
  
  this_00 = &this->UnresolvedQueue;
  iVar1 = osQueue::GetCount(this_00);
  if (0 < iVar1) {
    do {
      item = (long *)osQueue::Get(this_00);
      puVar2 = ProtocolARP::Protocol2Hardware(this->ARP,(uint8_t *)(*item + 0x10));
      if (puVar2 == (uint8_t *)0x0) {
        puts("Still could not find MAC for IP");
        osQueue::Put(this_00,item);
      }
      else {
        (*this->MAC->_vptr_InterfaceMAC[10])(this->MAC,item,puVar2,0x800);
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void ProtocolIPv4::Retry()
{
    int count;
    DataBuffer* buffer;
    const uint8_t* targetMAC;

    count = UnresolvedQueue.GetCount();
    for (int i = 0; i < count; i++)
    {
        buffer = (DataBuffer*)UnresolvedQueue.Get();

        targetMAC = ARP.Protocol2Hardware(&buffer->Packet[16]);
        if (targetMAC != nullptr)
        {
            MAC.Transmit(buffer, targetMAC, 0x0800);
        }
        else
        {
            printf("Still could not find MAC for IP\n");
            UnresolvedQueue.Put(buffer);
        }
    }
}